

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O1

FileType cmHexFileConverter::DetermineFileType(char *inFileName)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  ulong uVar3;
  FileType FVar4;
  FileType FVar5;
  uint uVar6;
  uint uVar7;
  char buf [1024];
  allocator local_449;
  string local_448;
  byte local_428 [1032];
  
  std::__cxx11::string::string((string *)&local_448,inFileName,&local_449);
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_448,"rb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  FVar4 = Binary;
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgets((char *)local_428,0x400,__stream);
    if (pcVar2 == (char *)0x0) {
      local_428[0] = 0;
    }
    fclose(__stream);
    if (local_428[0] == 0x3a) {
      uVar6 = 0x20b;
      uVar7 = 0xb;
      FVar5 = IntelHex;
    }
    else {
      if (local_428[0] != 0x53) {
        return Binary;
      }
      uVar6 = 0x20e;
      uVar7 = 10;
      FVar5 = MotorolaSrec;
    }
    uVar1 = ChompStrlen((char *)local_428);
    FVar4 = Binary;
    if ((uVar1 <= uVar6 && uVar7 <= uVar1) && (FVar4 = FVar5, 1 < uVar1)) {
      uVar3 = 1;
      do {
        if (9 < (byte)(local_428[uVar3] - 0x30)) {
          uVar6 = local_428[uVar3] - 0x41;
          if (0x25 < uVar6) {
            return Binary;
          }
          if ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            return Binary;
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return FVar4;
}

Assistant:

cmHexFileConverter::FileType cmHexFileConverter::DetermineFileType(
                                                        const char* inFileName)
{
  char buf[1024];
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  if (inFile == 0)
    {
    return Binary;
    }

  if(!fgets(buf, 1024, inFile))
    {
    buf[0] = 0;
    }
  fclose(inFile);
  FileType type = Binary;
  unsigned int minLineLength = 0;
  unsigned int maxLineLength = 0;
  if (buf[0] == ':') // might be an intel hex file
    {
    type = IntelHex;
    minLineLength = INTEL_HEX_MIN_LINE_LENGTH;
    maxLineLength = INTEL_HEX_MAX_LINE_LENGTH;
    }
  else if (buf[0] == 'S') // might be a motorola srec file
    {
    type = MotorolaSrec;
    minLineLength = MOTOROLA_SREC_MIN_LINE_LENGTH;
    maxLineLength = MOTOROLA_SREC_MAX_LINE_LENGTH;
    }
  else
    {
    return Binary;
    }

  unsigned int slen = ChompStrlen(buf);
  if ((slen < minLineLength) || (slen > maxLineLength))
    {
    return Binary;
    }

  for (unsigned int i = 1; i < slen; i++)
    {
    if (!cm_IsHexChar(buf[i]))
      {
      return Binary;
      }
    }
  return type;
}